

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O2

Pattern * slang::ast::TaggedPattern::fromSyntax
                    (TaggedPatternSyntax *syntax,Type *targetType,ASTContext *context)

{
  sockaddr *__addr;
  Compilation *comp;
  int iVar1;
  Type *pTVar2;
  Scope *this;
  FieldSymbol *args;
  undefined4 extraout_var;
  TaggedPattern *child;
  string_view name;
  Pattern *value;
  Pattern *local_40;
  SourceRange local_38;
  
  name = parsing::Token::valueText(&syntax->memberName);
  pTVar2 = Type::getCanonicalType(targetType);
  this = Symbol::scopeOrNull(&pTVar2->super_Symbol);
  args = (FieldSymbol *)Scope::find(this,name);
  local_40 = (Pattern *)0x0;
  __addr = (sockaddr *)syntax->pattern;
  if (__addr != (sockaddr *)0x0) {
    pTVar2 = DeclaredType::getType(&(args->super_VariableSymbol).super_ValueSymbol.declaredType);
    iVar1 = Pattern::bind((int)context,__addr,(socklen_t)pTVar2);
    local_40 = (Pattern *)CONCAT44(extraout_var,iVar1);
  }
  comp = ((context->scope).ptr)->compilation;
  local_38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  child = BumpAllocator::
          emplace<slang::ast::TaggedPattern,slang::ast::FieldSymbol_const&,slang::ast::Pattern_const*&,slang::SourceRange>
                    (&comp->super_BumpAllocator,args,&local_40,&local_38);
  if ((local_40 != (Pattern *)0x0) && (local_40->kind == Invalid)) {
    child = (TaggedPattern *)Pattern::badPattern(comp,&child->super_Pattern);
  }
  return &child->super_Pattern;
}

Assistant:

Pattern& TaggedPattern::fromSyntax(const TaggedPatternSyntax& syntax, const Type& targetType,
                                   const ASTContext& context) {
    SLANG_ASSERT(targetType.isTaggedUnion());

    auto memberName = syntax.memberName.valueText();
    auto member = targetType.getCanonicalType().as<Scope>().find(memberName);
    SLANG_ASSERT(member);

    auto& field = member->as<FieldSymbol>();

    const Pattern* value = nullptr;
    if (syntax.pattern)
        value = &Pattern::bind(context, *syntax.pattern, field.getType());

    auto& comp = context.getCompilation();
    auto result = comp.emplace<TaggedPattern>(field, value, syntax.sourceRange());
    if (value && value->bad())
        return badPattern(comp, result);

    return *result;
}